

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

rt_constant<double,_viennamath::rt_expression_interface<double>_> __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>>::operator()
          (rt_variable<viennamath::rt_expression_interface<double>> *this,
          rt_constant<double,_viennamath::rt_expression_interface<double>_> *other)

{
  double dVar1;
  undefined8 *puVar2;
  long in_RDX;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> rVar3;
  
  if (other->s == 0.0) {
    dVar1 = *(double *)(in_RDX + 8);
    *(undefined ***)this = &PTR__rt_expression_interface_00109ae8;
    *(double *)(this + 8) = dVar1;
    rVar3.s = dVar1;
    rVar3.super_rt_expression_interface<double>._vptr_rt_expression_interface = (_func_int **)this;
    return rVar3;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  dVar1 = other->s;
  *puVar2 = &PTR__exception_00109c90;
  puVar2[1] = dVar1;
  puVar2[2] = 0;
  __cxa_throw(puVar2,&variable_index_out_of_bounds_exception::typeinfo,std::exception::~exception);
}

Assistant:

rt_constant<ScalarType> operator()(rt_constant<ScalarType> const & other) const
      {
        if (id_ > 0)
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), 0);
        return rt_constant<ScalarType>(static_cast<ScalarType>(other));
      }